

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nqueens.c
# Opt level: O2

void run_WRAP(WorkerP *w,Task *__dq_head,TD_run *t)

{
  BDD BVar1;
  long lVar2;
  FILE *pFVar3;
  MTBDD MVar4;
  MTBDD MVar5;
  size_t sVar6;
  BDDVAR arg_3;
  BDDVAR arg_3_00;
  BDDVAR arg_3_01;
  BDDVAR arg_3_02;
  BDDVAR arg_3_03;
  BDDVAR arg_3_04;
  BDDVAR arg_3_05;
  BDDVAR arg_3_06;
  BDDVAR arg_3_07;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 uVar7;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  MTBDD *pMVar11;
  BDD BVar12;
  long lVar13;
  ulong uVar14;
  MTBDD *pMVar15;
  char *pcVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  size_t sStack_80;
  BDD BStack_78;
  ulong uStack_70;
  double dStack_68;
  MTBDD *pMStack_60;
  MTBDD MStack_58;
  MTBDD *pMStack_50;
  MTBDD *pMStack_48;
  MTBDD MStack_40;
  MTBDD MStack_38;
  
  sStack_80 = 0x102476;
  dStack_68 = wctime();
  lVar2 = -(size * size * 8 + 0xf & 0xfffffffffffffff0);
  pMVar11 = (MTBDD *)((long)&BStack_78 + lVar2);
  pMVar15 = pMVar11;
  for (uVar8 = 0; uVar8 < size * size; uVar8 = uVar8 + 1) {
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1024b3;
    MVar5 = mtbdd_ithvar((uint32_t)uVar8);
    *pMVar15 = MVar5;
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1024be;
    mtbdd_protect(pMVar15);
    pMVar15 = pMVar15 + 1;
  }
  MStack_38 = 0x8000000000000000;
  MStack_40 = 0x8000000000000000;
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1024eb;
  mtbdd_protect(&MStack_38);
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1024f3;
  mtbdd_protect(&MStack_40);
  MStack_58 = 0x8000000000000000;
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1024ff;
  mtbdd_protect(&MStack_58);
  uVar7 = extraout_RDX;
  for (uVar8 = 0; MVar5 = MStack_58, pFVar3 = _stdout, uVar8 < size * size; uVar8 = uVar8 + 1) {
    BVar12 = pMVar11[uVar8];
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x10251f;
    MStack_58 = sylvan_and_RUN(MVar5,BVar12,(BDDVAR)uVar7);
    uVar7 = extraout_RDX_00;
  }
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102537;
  dVar18 = wctime();
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102550;
  fprintf(pFVar3,"[% 8.2f] Initialisation complete!\n",dVar18 - t_start);
  pFVar3 = _stdout;
  pcVar16 = "[% 8.2f] Encoding rows...\n";
  if (report_minor != 0) {
    pcVar16 = "[% 8.2f] Encoding rows... ";
  }
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102571;
  dVar18 = wctime();
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102586;
  fprintf(pFVar3,pcVar16,dVar18 - t_start);
  lVar13 = 0;
  uVar8 = 0;
  uVar7 = extraout_RDX_01;
  while( true ) {
    if (size <= uVar8) break;
    if ((report_minor & 1) != 0) {
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1025b8;
      printf("%zu... ",uVar8);
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1025c7;
      fflush(_stdout);
      uVar7 = extraout_RDX_02;
    }
    for (uVar9 = 0; uVar9 < size; uVar9 = uVar9 + 1) {
      BVar12 = 0x8000000000000000;
      MStack_40 = 0x8000000000000000;
      uVar10 = size;
      for (uVar17 = 0; uVar17 < uVar10; uVar17 = uVar17 + 1) {
        if (uVar9 != uVar17) {
          uVar10 = *(ulong *)((long)pMVar11 + uVar17 * 8 + uVar10 * lVar13);
          *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102611;
          BVar12 = sylvan_and_RUN(BVar12,uVar10 ^ 0x8000000000000000,(BDDVAR)uVar7);
          MStack_40 = BVar12;
          uVar10 = size;
          uVar7 = extraout_RDX_03;
        }
      }
      BVar1 = pMVar11[uVar10 * uVar8 + uVar9];
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102649;
      BVar12 = sylvan_and_RUN(BVar12 ^ 0x8000000000000000,BVar1,(BDDVAR)uVar7);
      MVar5 = MStack_38;
      MStack_40 = BVar12 ^ 0x8000000000000000;
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x10265c;
      MStack_38 = sylvan_and_RUN(MVar5,BVar12 ^ 0x8000000000000000,arg_3);
      uVar7 = extraout_RDX_04;
    }
    uVar8 = uVar8 + 1;
    lVar13 = lVar13 + 8;
  }
  if ((report_minor & 1) != 0) {
    *(undefined8 *)((long)&sStack_80 + lVar2) = 10;
    uVar7 = *(undefined8 *)((long)&sStack_80 + lVar2);
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102681;
    putchar((int)uVar7);
  }
  pFVar3 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102699;
    dVar18 = wctime();
    MVar4 = MStack_38;
    MVar5 = MStack_58;
    pMStack_48 = (MTBDD *)(dVar18 - t_start);
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1026b3;
    dVar18 = sylvan_satcount_RUN(MVar4,MVar5,arg_3_00);
    pMVar15 = pMStack_48;
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1026cd;
    fprintf(pFVar3,"[% 8.2f] We have %.0f minterms\n",pMVar15,dVar18);
  }
  pFVar3 = _stdout;
  pcVar16 = "[% 8.2f] Encoding columns...\n";
  if (report_minor != 0) {
    pcVar16 = "[% 8.2f] Encoding columns... ";
  }
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1026f5;
  dVar18 = wctime();
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x10270a;
  fprintf(pFVar3,pcVar16,dVar18 - t_start);
  uVar8 = 0;
  uVar7 = extraout_RDX_05;
  while( true ) {
    if (size <= uVar8) break;
    if ((report_minor & 1) != 0) {
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102739;
      printf("%zu... ",uVar8);
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102748;
      fflush(_stdout);
      uVar7 = extraout_RDX_06;
    }
    for (uVar9 = 0; uVar9 < size; uVar9 = uVar9 + 1) {
      BVar12 = 0x8000000000000000;
      MStack_40 = 0x8000000000000000;
      uVar10 = size;
      for (uVar17 = 0; uVar17 < uVar10; uVar17 = uVar17 + 1) {
        if (uVar9 != uVar17) {
          uVar10 = pMVar11[uVar8 + uVar10 * uVar17];
          *(undefined8 *)((long)&sStack_80 + lVar2) = 0x10279a;
          BVar12 = sylvan_and_RUN(BVar12,uVar10 ^ 0x8000000000000000,(BDDVAR)uVar7);
          MStack_40 = BVar12;
          uVar10 = size;
          uVar7 = extraout_RDX_07;
        }
      }
      BVar1 = pMVar11[uVar8 + uVar10 * uVar9];
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1027c7;
      BVar12 = sylvan_and_RUN(BVar12 ^ 0x8000000000000000,BVar1,(BDDVAR)uVar7);
      MVar5 = MStack_38;
      MStack_40 = BVar12 ^ 0x8000000000000000;
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1027da;
      MStack_38 = sylvan_and_RUN(MVar5,BVar12 ^ 0x8000000000000000,arg_3_01);
      uVar7 = extraout_RDX_08;
    }
    uVar8 = uVar8 + 1;
  }
  if ((report_minor & 1) != 0) {
    *(undefined8 *)((long)&sStack_80 + lVar2) = 10;
    uVar7 = *(undefined8 *)((long)&sStack_80 + lVar2);
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1027fb;
    putchar((int)uVar7);
  }
  pFVar3 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102813;
    dVar18 = wctime();
    MVar4 = MStack_38;
    MVar5 = MStack_58;
    pMStack_48 = (MTBDD *)(dVar18 - t_start);
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x10282d;
    dVar18 = sylvan_satcount_RUN(MVar4,MVar5,arg_3_02);
    pMVar15 = pMStack_48;
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102847;
    fprintf(pFVar3,"[% 8.2f] We have %.0f minterms\n",pMVar15,dVar18);
  }
  pFVar3 = _stdout;
  pcVar16 = "[% 8.2f] Encoding rising diagonals...\n";
  if (report_minor != 0) {
    pcVar16 = "[% 8.2f] Encoding rising diagonals... ";
  }
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x10286f;
  dVar18 = wctime();
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102884;
  fprintf(pFVar3,pcVar16,dVar18 - t_start);
  uVar9 = 0;
  pMStack_48 = pMVar11;
  uVar8 = extraout_RDX_09;
  pMVar15 = pMVar11;
  while( true ) {
    if (size <= uVar9) break;
    if ((report_minor & 1) != 0) {
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1028ba;
      printf("%zu... ",uVar9);
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1028c9;
      fflush(_stdout);
      uVar8 = extraout_RDX_10;
    }
    pMStack_50 = pMVar11;
    for (uVar10 = 0; uVar10 < size; uVar10 = uVar10 + 1) {
      BVar12 = 0x8000000000000000;
      MStack_40 = 0x8000000000000000;
      lVar13 = 0;
      uVar17 = size;
      for (uVar14 = 0; pMVar15 = pMStack_48, uVar14 < uVar17; uVar14 = uVar14 + 1) {
        if (((uVar9 != uVar14) && (uVar9 <= uVar10 + uVar14)) &&
           (uVar8 = uVar17 + uVar9, uVar10 + uVar14 < uVar8)) {
          uVar17 = *(ulong *)((long)pMVar11 + uVar14 * 8 + uVar17 * lVar13);
          *(undefined8 *)((long)&sStack_80 + lVar2) = 0x10292c;
          BVar12 = sylvan_and_RUN(BVar12,uVar17 ^ 0x8000000000000000,(BDDVAR)uVar8);
          MStack_40 = BVar12;
          uVar17 = size;
          uVar8 = extraout_RDX_11;
        }
        lVar13 = lVar13 + 8;
      }
      BVar1 = pMStack_48[uVar17 * uVar9 + uVar10];
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x10296c;
      BVar12 = sylvan_and_RUN(BVar12 ^ 0x8000000000000000,BVar1,(BDDVAR)uVar8);
      MVar5 = MStack_38;
      MStack_40 = BVar12 ^ 0x8000000000000000;
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x10297f;
      MStack_38 = sylvan_and_RUN(MVar5,BVar12 ^ 0x8000000000000000,arg_3_03);
      pMVar11 = pMVar11 + 1;
      uVar8 = extraout_RDX_12;
    }
    uVar9 = uVar9 + 1;
    pMVar11 = pMStack_50 + -1;
  }
  if ((report_minor & 1) != 0) {
    *(undefined8 *)((long)&sStack_80 + lVar2) = 10;
    uVar7 = *(undefined8 *)((long)&sStack_80 + lVar2);
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1029ac;
    putchar((int)uVar7);
  }
  pFVar3 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1029c4;
    dVar18 = wctime();
    MVar4 = MStack_38;
    MVar5 = MStack_58;
    pMStack_50 = (MTBDD *)(dVar18 - t_start);
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1029de;
    dVar18 = sylvan_satcount_RUN(MVar4,MVar5,arg_3_04);
    pMVar11 = pMStack_50;
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x1029f8;
    fprintf(pFVar3,"[% 8.2f] We have %.0f minterms\n",pMVar11,dVar18);
  }
  pFVar3 = _stdout;
  pcVar16 = "[% 8.2f] Encoding falling diagonals...\n";
  if (report_minor != 0) {
    pcVar16 = "[% 8.2f] Encoding falling diagonals... ";
  }
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102a20;
  dVar18 = wctime();
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102a35;
  fprintf(pFVar3,pcVar16,dVar18 - t_start);
  pMStack_60 = pMVar15;
  uVar8 = 0;
  uVar7 = extraout_RDX_13;
  while( true ) {
    if (size <= uVar8) break;
    if ((report_minor & 1) != 0) {
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102a68;
      printf("%zu... ",uVar8);
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102a77;
      fflush(_stdout);
      uVar7 = extraout_RDX_14;
    }
    uVar9 = 0;
    pMVar11 = pMStack_60;
    while (uVar9 < size) {
      BVar12 = 0x8000000000000000;
      MStack_40 = 0x8000000000000000;
      lVar13 = 0;
      uVar10 = size;
      uStack_70 = uVar9;
      pMStack_50 = pMVar11;
      for (uVar17 = 0; pMVar15 = pMStack_48, uVar14 = uStack_70, uVar17 < uVar10;
          uVar17 = uVar17 + 1) {
        if (((uVar8 != uVar17) && (uVar17 <= uVar9 + uVar8)) && (uVar9 + uVar8 < uVar10 + uVar17)) {
          uVar10 = *(ulong *)((long)pMVar11 + uVar10 * lVar13);
          *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102adf;
          BVar12 = sylvan_and_RUN(BVar12,uVar10 ^ 0x8000000000000000,(BDDVAR)uVar7);
          uVar10 = size;
          uVar7 = extraout_RDX_15;
          MStack_40 = BVar12;
        }
        pMVar11 = pMVar11 + -1;
        lVar13 = lVar13 + 8;
      }
      BVar1 = pMStack_48[uVar10 * uVar8 + uStack_70];
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102b27;
      BVar12 = sylvan_and_RUN(BVar12 ^ 0x8000000000000000,BVar1,(BDDVAR)uVar7);
      MVar5 = MStack_38;
      MStack_40 = BVar12 ^ 0x8000000000000000;
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102b3a;
      MStack_38 = sylvan_and_RUN(MVar5,BVar12 ^ 0x8000000000000000,arg_3_05);
      pMVar11 = pMStack_50 + 1;
      uVar7 = extraout_RDX_16;
      uVar9 = uVar14 + 1;
    }
    uVar8 = uVar8 + 1;
    pMStack_60 = pMStack_60 + 1;
  }
  if ((report_minor & 1) != 0) {
    *(undefined8 *)((long)&sStack_80 + lVar2) = 10;
    uVar7 = *(undefined8 *)((long)&sStack_80 + lVar2);
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102b68;
    putchar((int)uVar7);
  }
  pFVar3 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102b80;
    dVar18 = wctime();
    MVar4 = MStack_38;
    MVar5 = MStack_58;
    pMStack_48 = (MTBDD *)(dVar18 - t_start);
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102b9a;
    dVar18 = sylvan_satcount_RUN(MVar4,MVar5,arg_3_06);
    pMVar11 = pMStack_48;
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102bb4;
    fprintf(pFVar3,"[% 8.2f] We have %.0f minterms\n",pMVar11,dVar18);
  }
  pFVar3 = _stdout;
  pcVar16 = "[% 8.2f] Final computation to place a queen on every row...\n";
  if (report_minor != 0) {
    pcVar16 = "[% 8.2f] Final computation to place a queen on every row... ";
  }
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102bdc;
  dVar18 = wctime();
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102bf1;
  fprintf(pFVar3,pcVar16,dVar18 - t_start);
  lVar13 = 0;
  uVar7 = extraout_RDX_17;
  for (uVar8 = 0; uVar8 < size; uVar8 = uVar8 + 1) {
    if ((report_minor & 1) != 0) {
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102c25;
      printf("%zu... ",uVar8);
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102c34;
      fflush(_stdout);
      uVar7 = extraout_RDX_18;
    }
    MStack_40 = 0;
    uVar9 = 0;
    while( true ) {
      MVar4 = MStack_38;
      MVar5 = MStack_40;
      if (size <= uVar9) break;
      uVar17 = MStack_40 ^ 0x8000000000000000;
      uVar10 = *(ulong *)((long)pMVar15 + uVar9 * 8 + size * lVar13);
      *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102c63;
      BVar12 = sylvan_and_RUN(uVar17,uVar10 ^ 0x8000000000000000,(BDDVAR)uVar7);
      MStack_40 = BVar12 ^ 0x8000000000000000;
      uVar9 = uVar9 + 1;
      uVar7 = extraout_RDX_19;
    }
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102c7b;
    MStack_38 = sylvan_and_RUN(MVar4,MVar5,(BDDVAR)uVar7);
    lVar13 = lVar13 + 8;
    uVar7 = extraout_RDX_20;
  }
  if ((report_minor & 1) != 0) {
    *(undefined8 *)((long)&sStack_80 + lVar2) = 10;
    uVar7 = *(undefined8 *)((long)&sStack_80 + lVar2);
    *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102c97;
    putchar((int)uVar7);
  }
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102c9c;
  pMStack_48 = (MTBDD *)wctime();
  pFVar3 = _stdout;
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102cb0;
  dVar18 = wctime();
  MVar4 = MStack_38;
  MVar5 = MStack_58;
  sVar6 = size;
  pMStack_50 = (MTBDD *)(dVar18 - t_start);
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102cd1;
  dVar18 = sylvan_satcount_RUN(MVar4,MVar5,arg_3_07);
  pMVar15 = pMStack_50;
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102cee;
  fprintf(pFVar3,"[% 8.2f] Result: NQueens(%zu) has %.0f solutions.\n",pMVar15,dVar18,sVar6);
  pFVar3 = _stdout;
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102cf6;
  dVar18 = wctime();
  pMStack_50 = (MTBDD *)(dVar18 - t_start);
  BStack_78 = MStack_38;
  *(undefined8 *)((long)&sStack_80 + lVar2) = 1;
  sVar6 = *(size_t *)((long)&sStack_80 + lVar2);
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102d16;
  sVar6 = mtbdd_nodecount_more(&BStack_78,sVar6);
  pMVar15 = pMStack_50;
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102d2f;
  fprintf(pFVar3,"[% 8.2f] Result BDD has %zu nodes.\n",pMVar15,sVar6);
  pFVar3 = _stdout;
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102d37;
  dVar18 = wctime();
  dVar19 = (double)pMStack_48 - dStack_68;
  *(undefined8 *)((long)&sStack_80 + lVar2) = 0x102d5a;
  fprintf(pFVar3,"[% 8.2f] Computation time: %f sec.\n",dVar18 - t_start,dVar19);
  return;
}

Assistant:

VOID_TASK_0(run)
{
    double t1 = wctime();

    BDD zero = sylvan_false;
    BDD one = sylvan_true;

    // Variables 0 ... (SIZE*SIZE-1)

    BDD board[size*size];
    for (size_t i=0; i<size*size; i++) {
        board[i] = sylvan_ithvar(i);
        sylvan_protect(board+i);
    }

    BDD res = one, temp = one;

    // we use sylvan's "protect" marking mechanism...
    // that means we hardly need to do manual ref/deref when the variables change
    sylvan_protect(&res);
    sylvan_protect(&temp);

    // Old satcount function still requires a silly variables cube
    BDD vars = one;
    sylvan_protect(&vars);
    for (size_t i=0; i<size*size; i++) vars = sylvan_and(vars, board[i]);

    INFO("Initialisation complete!\n");

    if (report_minor) {
        INFO("Encoding rows... ");
    } else {
        INFO("Encoding rows...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            // compute "\BigAnd (!board[i][k]) \or !board[i][j]" with k != j
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (j==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[i*size+k]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding columns... ");
    } else {
        INFO("Encoding columns...\n");
    }

    for (size_t j=0; j<size; j++) {
        if (report_minor) {
            printf("%zu... ", j);
            fflush(stdout);
        }

        for (size_t i=0; i<size; i++) {
            // compute "\BigAnd (!board[k][j]) \or !board[i][j]" with k != i
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (i==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[k*size+j]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding rising diagonals... ");
    } else {
        INFO("Encoding rising diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+k-i >= 0 && j+k-i < size && k != i)
                if (j+k >= i && j+k < size+i && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+k-i)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding falling diagonals... ");
    } else {
        INFO("Encoding falling diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+i-k >= 0 && j+i-k < size && k != i)
                if (j+i >= k && j+i < size+k && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+i-k)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size + j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Final computation to place a queen on every row... ");
    } else {
        INFO("Final computation to place a queen on every row...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        temp = zero;
        for (size_t j=0; j<size; j++) {
            temp = sylvan_or(temp, board[i*size+j]);
        }
        res = sylvan_and(res, temp);
    }

    if (report_minor) {
        printf("\n");
    }

    double t2 = wctime();

    INFO("Result: NQueens(%zu) has %.0f solutions.\n", size, sylvan_satcount(res, vars));
    INFO("Result BDD has %zu nodes.\n", sylvan_nodecount(res));
    INFO("Computation time: %f sec.\n", t2-t1);
}